

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilWriteMaskTestCase::test
          (StencilWriteMaskTestCase *this)

{
  RenderTarget *pRVar1;
  int iVar2;
  int iVar3;
  uint mask;
  
  pRVar1 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar3 = pRVar1->m_stencilBits;
  iVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    mask = 1 << ((byte)iVar2 & 0x1f);
    glu::CallLogWrapper::glStencilMask(&(this->super_ApiCase).super_CallLogWrapper,mask);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               (ulong)this->m_testTargetName,(ulong)mask);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int mask = 1 << stencilBit;

			glStencilMask(mask);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, mask);
			expectError(GL_NO_ERROR);
		}
	}